

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_ctrlpt.c
# Opt level: O0

int gena_unsubscribe(UpnpString *url,UpnpString *sid,http_parser_t *response)

{
  char *pcVar1;
  size_t urlstrlen;
  undefined1 local_120 [8];
  membuffer request;
  uri_type dest_url;
  int return_code;
  http_parser_t *response_local;
  UpnpString *sid_local;
  UpnpString *url_local;
  
  pcVar1 = UpnpString_get_String(url);
  urlstrlen = UpnpString_get_Length(url);
  url_local._4_4_ = http_FixStrUrl(pcVar1,urlstrlen,(uri_type *)&request.size_inc);
  if (url_local._4_4_ == 0) {
    membuffer_init((membuffer *)local_120);
    request.capacity = 0x1e;
    pcVar1 = UpnpString_get_String(sid);
    url_local._4_4_ =
         http_MakeMessage((membuffer *)local_120,1,1,"qsscUc",7,&request.size_inc,"SID: ",pcVar1);
    if (url_local._4_4_ == 0) {
      dest_url.hostport.IPaddress.__ss_align._4_4_ =
           http_RequestAndResponse
                     ((uri_type *)&request.size_inc,(char *)local_120,(size_t)request.buf,
                      HTTPMETHOD_UNSUBSCRIBE,0x1e,response);
      membuffer_destroy((membuffer *)local_120);
      if (dest_url.hostport.IPaddress.__ss_align._4_4_ == 0) {
        if ((response->msg).status_code != 200) {
          dest_url.hostport.IPaddress.__ss_align._4_4_ = -0x12e;
          httpmsg_destroy(&response->msg);
        }
      }
      else {
        httpmsg_destroy(&response->msg);
      }
      url_local._4_4_ = dest_url.hostport.IPaddress.__ss_align._4_4_;
    }
    else {
      membuffer_destroy((membuffer *)local_120);
    }
  }
  return url_local._4_4_;
}

Assistant:

static int gena_unsubscribe(
	/*! [in] Event URL of the service. */
	const UpnpString *url,
	/*! [in] The subcription ID. */
	const UpnpString *sid,
	/*! [out] The UNSUBCRIBE response from the device. */
	http_parser_t *response)
{
	int return_code;
	uri_type dest_url;
	membuffer request;

	/* parse url */
	return_code = http_FixStrUrl(UpnpString_get_String(url),
		UpnpString_get_Length(url),
		&dest_url);
	if (return_code != 0) {
		return return_code;
	}

	/* make request msg */
	membuffer_init(&request);
	request.size_inc = 30;
	return_code = http_MakeMessage(&request,
		1,
		1,
		"q"
		"ssc"
		"Uc",
		HTTPMETHOD_UNSUBSCRIBE,
		&dest_url,
		"SID: ",
		UpnpString_get_String(sid));

	/* Not able to make the message so destroy the existing buffer */
	if (return_code != 0) {
		membuffer_destroy(&request);

		return return_code;
	}

	/* send request and get reply */
	return_code = http_RequestAndResponse(&dest_url,
		request.buf,
		request.length,
		HTTPMETHOD_UNSUBSCRIBE,
		HTTP_DEFAULT_TIMEOUT,
		response);
	membuffer_destroy(&request);
	if (return_code != 0) {
		httpmsg_destroy(&response->msg);
	}

	if (return_code == 0 && response->msg.status_code != HTTP_OK) {
		return_code = UPNP_E_UNSUBSCRIBE_UNACCEPTED;
		httpmsg_destroy(&response->msg);
	}

	return return_code;
}